

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getTextureFormatMantissaBitDepth(tcu *this,TextureFormat *format)

{
  bool abVar1 [4];
  TextureSwizzle *pTVar2;
  long lVar3;
  int s;
  long lVar4;
  long lVar5;
  Channel CVar6;
  Channel CVar8;
  Channel CVar9;
  Channel CVar10;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  Vector<int,_4> VVar12;
  IVec4 IVar13;
  Vector<int,_4> local_68;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  Vector<bool,_4> local_44;
  Vector<int,_4> local_40;
  Vector<int,_4> local_30;
  
  switch(format->type) {
  case SNORM_INT8:
  case SNORM_INT16:
  case SNORM_INT32:
  case UNORM_INT8:
  case UNORM_INT16:
  case UNORM_INT24:
  case UNORM_INT32:
  case UNORM_BYTE_44:
  case UNORM_SHORT_565:
  case UNORM_SHORT_555:
  case UNORM_SHORT_4444:
  case UNORM_SHORT_5551:
  case UNORM_SHORT_1555:
  case UNORM_INT_101010:
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case UNSIGNED_BYTE_44:
  case UNSIGNED_SHORT_565:
  case UNSIGNED_SHORT_4444:
  case UNSIGNED_SHORT_5551:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
  case UNSIGNED_INT_999_E5_REV:
  case UNSIGNED_INT_16_8_8:
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
  case SIGNED_INT8:
  case SIGNED_INT16:
  case SIGNED_INT32:
  case UNSIGNED_INT8:
  case UNSIGNED_INT16:
  case UNSIGNED_INT24:
  case UNSIGNED_INT32:
    getChannelBitDepth((tcu *)&local_68,format->type);
    goto LAB_0096ea26;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_68.m_data[0] = 6;
    local_68.m_data[1] = 6;
    local_68.m_data[2] = 5;
    local_68.m_data[3] = 0;
    goto LAB_0096ea26;
  case HALF_FLOAT:
    s = 10;
    break;
  case FLOAT:
    s = 0x17;
    break;
  case FLOAT64:
    s = 0x34;
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    local_68.m_data[0] = 0x17;
    local_68.m_data[1] = 8;
    local_68.m_data[2] = 0;
    local_68.m_data[3] = 0;
    goto LAB_0096ea26;
  default:
    s = 0;
  }
  Vector<int,_4>::Vector(&local_68,s);
LAB_0096ea26:
  pTVar2 = getChannelReadSwizzle(format->order);
  CVar6 = pTVar2->components[0] ^ 0x80000000;
  CVar8 = pTVar2->components[1] ^ 0x80000000;
  CVar9 = pTVar2->components[2] ^ 0x80000000;
  CVar10 = pTVar2->components[3] ^ 0x80000000;
  local_58 = -(uint)((int)CVar6 < -0x7ffffffc);
  uStack_54 = -(uint)((int)CVar8 < -0x7ffffffc);
  uStack_50 = -(uint)((int)CVar9 < -0x7ffffffc);
  uStack_4c = -(uint)((int)CVar10 < -0x7ffffffc);
  auVar7._0_4_ = -(uint)(-0x7ffffffd < (int)CVar6);
  auVar7._4_4_ = -(uint)(-0x7ffffffd < (int)CVar8);
  auVar7._8_4_ = -(uint)(-0x7ffffffd < (int)CVar9);
  auVar7._12_4_ = -(uint)(-0x7ffffffd < (int)CVar10);
  auVar7 = packssdw(auVar7,auVar7);
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar11._12_4_ = 0xffffffff;
  auVar7 = packsswb(auVar11 ^ auVar7,auVar11 ^ auVar7);
  abVar1 = (bool  [4])(auVar7._0_4_ & (uint)DAT_009b0350);
  local_44.m_data[0] = abVar1[0];
  local_44.m_data[1] = abVar1[1];
  local_44.m_data[2] = abVar1[2];
  local_44.m_data[3] = abVar1[3];
  lVar5 = 0;
  lVar3 = (long)(int)pTVar2->components[0];
  if ((local_58 & 1) == 0) {
    lVar3 = lVar5;
  }
  local_30.m_data[0] = local_68.m_data[lVar3];
  lVar3 = (long)(int)pTVar2->components[1];
  if ((uStack_54 & 1) == 0) {
    lVar3 = lVar5;
  }
  lVar4 = (long)(int)pTVar2->components[2];
  if ((uStack_50 & 1) == 0) {
    lVar4 = lVar5;
  }
  local_30.m_data[1] = local_68.m_data[lVar3];
  local_30.m_data[2] = local_68.m_data[lVar4];
  lVar3 = (long)(int)pTVar2->components[3];
  if ((uStack_4c & 1) == 0) {
    lVar3 = lVar5;
  }
  local_30.m_data[3] = local_68.m_data[lVar3];
  Vector<int,_4>::Vector(&local_40,0);
  VVar12 = select<int,4>(this,&local_30,&local_40,&local_44);
  IVar13.m_data._8_8_ = VVar12.m_data._8_8_;
  IVar13.m_data._0_8_ = this;
  return (IVec4)IVar13.m_data;
}

Assistant:

IVec4 getTextureFormatMantissaBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelMantissaBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}